

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall vmips::Unconditional::output(Unconditional *this,ostream *out)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  element_type *peVar3;
  shared_ptr<vmips::CFGNode> local_28;
  ostream *local_18;
  ostream *out_local;
  Unconditional *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  iVar1 = (*(this->super_Instruction)._vptr_Instruction[1])();
  poVar2 = std::operator<<(out,(char *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2," ");
  std::weak_ptr<vmips::CFGNode>::lock((weak_ptr<vmips::CFGNode> *)&local_28);
  peVar3 = std::__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_28);
  std::operator<<(poVar2,(string *)&peVar3->label);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr(&local_28);
  return;
}

Assistant:

void Unconditional::output(std::ostream &out) const {
    out << name() << " " << block.lock()->label;
}